

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_tls_read_curve_info(mbedtls_ecp_curve_info **curve_info,uchar **buf,size_t blen)

{
  mbedtls_ecp_curve_info *pmVar1;
  uchar uVar2;
  uchar *puVar3;
  mbedtls_ecp_curve_info *curve_info_1;
  mbedtls_ecp_curve_info *pmVar4;
  
  curve_info_1._0_4_ = -0x4f80;
  if (2 < blen) {
    puVar3 = *buf;
    *buf = puVar3 + 1;
    if (*puVar3 == '\x03') {
      *buf = puVar3 + 2;
      uVar2 = puVar3[1];
      *buf = puVar3 + 3;
      pmVar4 = ecp_supported_curves;
      do {
        if (pmVar4->tls_id == CONCAT11(uVar2,puVar3[2])) goto LAB_00127df8;
        pmVar1 = pmVar4 + 1;
        pmVar4 = pmVar4 + 1;
      } while (pmVar1->grp_id != MBEDTLS_ECP_DP_NONE);
      pmVar4 = (mbedtls_ecp_curve_info *)0x0;
LAB_00127df8:
      *curve_info = pmVar4;
      curve_info_1._0_4_ = -0x4e80;
      if (pmVar4 != (mbedtls_ecp_curve_info *)0x0) {
        curve_info_1._0_4_ = 0;
      }
    }
  }
  return (int)curve_info_1;
}

Assistant:

int mbedtls_ecp_tls_read_curve_info( mbedtls_ecp_curve_info const* *curve_info,
  const unsigned char **buf, size_t blen )
{
    uint16_t tls_id;

    /*
     * We expect at least three bytes (see below)
     */
    if( blen < 3 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * First byte is curve_type; only named_curve is handled
     */
    if( *(*buf)++ != MBEDTLS_ECP_TLS_NAMED_CURVE )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Next two bytes are the namedcurve value
     */
    tls_id = *(*buf)++;
    tls_id <<= 8;
    tls_id |= *(*buf)++;

    if( ( *curve_info = mbedtls_ecp_curve_info_from_tls_id( tls_id ) ) == NULL )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    return( 0 );
}